

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-sw.c
# Opt level: O0

void sha256_sw_digest(ssh_hash *hash,uint8_t *digest)

{
  ulong local_28;
  size_t i;
  sha256_sw *s;
  uint8_t *digest_local;
  ssh_hash *hash_local;
  
  sha256_block_pad((sha256_block *)&hash[-7].binarysink_,(BinarySink *)&hash[-2].binarysink_);
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    PUT_32BIT_MSB_FIRST(digest + local_28 * 4,*(uint32_t *)((long)hash + local_28 * 4 + -0x88));
  }
  return;
}

Assistant:

static void sha256_sw_digest(ssh_hash *hash, uint8_t *digest)
{
    sha256_sw *s = container_of(hash, sha256_sw, hash);

    sha256_block_pad(&s->blk, BinarySink_UPCAST(s));
    for (size_t i = 0; i < 8; i++)
        PUT_32BIT_MSB_FIRST(digest + 4*i, s->core[i]);
}